

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
run_for<(Analyser::Static::PCCompatible::Target::Speed)1>
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
          Cycles duration)

{
  uint16_t uVar1;
  bool bVar2;
  int index;
  uint16_t *puVar3;
  Cycles local_38;
  Cycles local_30;
  Cycles local_28;
  int local_20;
  int local_1c;
  int ticks;
  int pit_ticks;
  ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this_local;
  Cycles duration_local;
  
  _ticks = this;
  this_local = (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *)
               duration.super_WrappedInt<Cycles>.length_;
  local_20 = WrappedInt<Cycles>::as<int>((WrappedInt<Cycles> *)&this_local);
  local_1c = local_20;
  while (local_20 != 0) {
    local_20 = local_20 + -1;
    Cycles::Cycles(&local_28,1);
    i8253<false,_PCCompatible::PITObserver>::run_for(&this->pit_,local_28);
    WrappedInt<Cycles>::operator++(&(this->speaker_).cycles_since_update.super_WrappedInt<Cycles>);
    Cycles::Cycles(&local_30,1);
    MDA::run_for(&this->video_,local_30);
    Cycles::Cycles(&local_38,1);
    KeyboardController::run_for(&this->keyboard_,local_38);
    bVar2 = PIC::pending(&this->pic_);
    if ((bVar2) &&
       (bVar2 = InstructionSet::x86::Flags::flag<(InstructionSet::x86::Flag)5>
                          (&(this->context).flags), bVar2)) {
      bVar2 = FlowController::should_repeat(&(this->context).flow_controller);
      if (bVar2) {
        uVar1 = this->decoded_ip_;
        puVar3 = Registers::ip(&(this->context).registers);
        *puVar3 = uVar1;
        FlowController::begin_instruction(&(this->context).flow_controller);
      }
      FlowController::unhalt(&(this->context).flow_controller);
      index = PIC::acknowledge(&this->pic_);
      InstructionSet::x86::
      interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                (index,&this->context);
    }
    bVar2 = FlowController::halted(&(this->context).flow_controller);
    if (!bVar2) {
      perform_instruction(this);
      perform_instruction(this);
    }
  }
  return;
}

Assistant:

void run_for(const Cycles duration) {
			const auto pit_ticks = duration.as<int>();

			int ticks;
			if constexpr (speed == Target::Speed::Fast) {
				ticks = pit_ticks;
			} else {
				cpu_divisor_ += pit_ticks;
				ticks = cpu_divisor_ / 3;
				cpu_divisor_ %= 3;
			}

			while(ticks--) {
				//
				// First draft: all hardware runs in lockstep, as a multiple or divisor of the PIT frequency.
				//

				//
				// Advance the PIT and audio.
				//
				pit_.run_for(1);
				++speaker_.cycles_since_update;

				// For original speed, the CPU performs instructions at a 1/3rd divider of the PIT clock,
				// so run the PIT three times per 'tick'.
				if constexpr (speed == Target::Speed::ApproximatelyOriginal) {
					pit_.run_for(1);
					++speaker_.cycles_since_update;
					pit_.run_for(1);
					++speaker_.cycles_since_update;
				}

				//
				// Advance CRTC at a more approximate rate.
				//
				video_.run_for(speed == Target::Speed::Fast ? Cycles(1) : Cycles(3));

				//
				// Give the keyboard a notification of passing time; it's very approximately clocked,
				// really just including 'some' delays to avoid being instant.
				//
				keyboard_.run_for(Cycles(1));

				//
				// Perform one CPU instruction every three PIT cycles.
				// i.e. CPU instruction rate is 1/3 * ~1.19Mhz ~= 0.4 MIPS.
				//

				// Query for interrupts and apply if pending.
				if(pic_.pending() && context.flags.template flag<InstructionSet::x86::Flag::Interrupt>()) {
					// Regress the IP if a REP is in-progress so as to resume it later.
					if(context.flow_controller.should_repeat()) {
						context.registers.ip() = decoded_ip_;
						context.flow_controller.begin_instruction();
					}

					// Signal interrupt.
					context.flow_controller.unhalt();
					InstructionSet::x86::interrupt(
						pic_.acknowledge(),
						context
					);
				}

				// Do nothing if currently halted.
				if(context.flow_controller.halted()) {
					continue;
				}

				if constexpr (speed == Target::Speed::Fast) {
					// There's no divider applied, so this makes for 2*PIT = around 2.4 MIPS.
					// That's broadly 80286 speed, if MIPS were a valid measure.
					perform_instruction();
					perform_instruction();
				} else {
					// With the clock divider above, this makes for a net of PIT/3 = around 0.4 MIPS.
					// i.e. a shade more than 8086 speed, if MIPS were meaningful.
					perform_instruction();
				}

				// Other inevitably broad and fuzzy and inconsistent MIPS counts for my own potential future play:
				//
				// 80386 @ 20Mhz: 4–5 MIPS.
				// 80486 @ 66Mhz: 25 MIPS.
				// Pentium @ 100Mhz: 188 MIPS.
			}
		}